

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<32,_2048>::Reset(ObjectBlockPool<32,_2048> *this)

{
  LargeBlock<32,_2048> *pLVar1;
  MyLargeBlock *ptr;
  
  ptr = this->activePages;
  if (this->activePages != (MyLargeBlock *)0x0) {
    do {
      pLVar1 = ptr->next;
      NULLC::alignedDealloc(ptr);
      this->activePages = pLVar1;
      ptr = pLVar1;
    } while (pLVar1 != (LargeBlock<32,_2048> *)0x0);
    this->freeBlocks = &this->lastBlock;
    this->activePages = (MyLargeBlock *)0x0;
    this->lastNum = 0x800;
    if ((this->sortedPages).data != (LargeBlock<32,_2048> **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    (this->sortedPages).data = (LargeBlock<32,_2048> **)0x0;
    (this->sortedPages).max = 0;
    (this->sortedPages).count = 0;
    if ((this->objectsToFinalize).data != (SmallBlock<32> **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    (this->objectsToFinalize).data = (SmallBlock<32> **)0x0;
    (this->objectsToFinalize).max = 0;
    (this->objectsToFinalize).count = 0;
    if ((this->objectsToFree).data != (SmallBlock<32> **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    (this->objectsToFree).data = (SmallBlock<32> **)0x0;
    (this->objectsToFree).max = 0;
    (this->objectsToFree).count = 0;
  }
  return;
}

Assistant:

void Reset()
	{
		if(!activePages)
			return;
		do
		{
			MyLargeBlock* following = activePages->next;
			NULLC::alignedDealloc(activePages);
			activePages = following;
		}while(activePages != NULL);

		freeBlocks = &lastBlock;
		activePages = NULL;
		lastNum = countInBlock;

		sortedPages.reset();
		objectsToFinalize.reset();
		objectsToFree.reset();
	}